

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O2

char * jsonnet_evaluate_file(JsonnetVm *vm,char *filename,int *error)

{
  char *pcVar1;
  
  pcVar1 = jsonnet_evaluate_file_aux(vm,filename,error,REGULAR);
  return pcVar1;
}

Assistant:

char *jsonnet_evaluate_file(JsonnetVm *vm, const char *filename, int *error)
{
    TRY
        return jsonnet_evaluate_file_aux(vm, filename, error, REGULAR);
    CATCH("jsonnet_evaluate_file")
    return nullptr;  // Never happens.
}